

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::switch_statement::print(switch_statement *this,wostream *os)

{
  bool bVar1;
  bool bVar2;
  wostream *pwVar3;
  syntax_node *psVar4;
  clause_list *this_00;
  reference this_01;
  unique_ptr *this_02;
  expression_ptr *this_03;
  statement_list *psVar5;
  size_type sVar6;
  const_reference this_04;
  ulong local_48;
  size_t i;
  case_clause *c;
  const_iterator __end2;
  const_iterator __begin2;
  clause_list *__range2;
  bool first;
  wostream *os_local;
  switch_statement *this_local;
  
  pwVar3 = std::operator<<(os,"switch_statement{");
  psVar4 = &e(this)->super_syntax_node;
  pwVar3 = mjs::operator<<(pwVar3,psVar4);
  std::operator<<(pwVar3,", [");
  bVar1 = true;
  this_00 = cl(this);
  __end2 = std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::begin(this_00);
  c = (case_clause *)std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
                                     *)&c), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
              ::operator*(&__end2);
    if (!bVar1) {
      std::operator<<(os,", ");
    }
    bVar1 = false;
    std::operator<<(os,"{");
    this_02 = (unique_ptr *)case_clause::e(this_01);
    bVar2 = std::unique_ptr::operator_cast_to_bool(this_02);
    if (bVar2) {
      this_03 = case_clause::e(this_01);
      psVar4 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                          (this_03)->super_syntax_node;
      pwVar3 = mjs::operator<<(os,psVar4);
      std::operator<<(pwVar3,", ");
    }
    std::operator<<(os,"[");
    local_48 = 0;
    while( true ) {
      psVar5 = case_clause::sl(this_01);
      sVar6 = std::
              vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
              ::size(psVar5);
      if (sVar6 <= local_48) break;
      if (local_48 != 0) {
        std::operator<<(os,", ");
      }
      psVar5 = case_clause::sl(this_01);
      this_04 = std::
                vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                ::operator[](psVar5,local_48);
      psVar4 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                          (this_04)->super_syntax_node;
      mjs::operator<<(os,psVar4);
      local_48 = local_48 + 1;
    }
    std::operator<<(os,"]}");
    __gnu_cxx::
    __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "switch_statement{" << e() << ", [";
        bool first = true;
        for (const auto& c: cl()) {
            if (!first) os << ", ";
            first = false;
            os << "{";
            if (c.e()) {
                os << *c.e() << ", ";
            }
            os << "[";
            for (size_t i = 0; i < c.sl().size(); ++i) {
                if (i) os << ", ";
                os << *c.sl()[i];
            }
            os << "]}";
        }
        os << "]}";
    }